

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5CacheInstArray(Fts5Cursor *pCsr)

{
  int iVar1;
  int iVar2;
  Fts5PoslistReader *pFVar3;
  u8 *puVar4;
  int *pOld;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int n;
  int local_4c;
  Fts5PoslistReader *local_48;
  u8 *local_40;
  u8 *a;
  
  local_4c = 0;
  uVar8 = 0;
  if (pCsr->pExpr != (Fts5Expr *)0x0) {
    uVar8 = pCsr->pExpr->nPhrase;
  }
  iVar1 = *(int *)&((pCsr->base).pVtab[1].pModule)->xBestIndex;
  pFVar3 = pCsr->aInstIter;
  if (pFVar3 == (Fts5PoslistReader *)0x0) {
    pFVar3 = (Fts5PoslistReader *)sqlite3Fts5MallocZero(&local_4c,(long)(int)uVar8 << 5);
    pCsr->aInstIter = pFVar3;
    if (pFVar3 == (Fts5PoslistReader *)0x0) {
      return local_4c;
    }
  }
  lVar12 = 0;
  iVar2 = local_4c;
  local_48 = pFVar3;
  while ((lVar12 < (int)uVar8 && (iVar2 == 0))) {
    iVar2 = fts5CsrPoslist(pCsr,(int)lVar12,&a,&n);
    if (iVar2 == 0) {
      sqlite3Fts5PoslistReaderInit(a,n,pFVar3);
    }
    lVar12 = lVar12 + 1;
    pFVar3 = pFVar3 + 1;
  }
  uVar10 = 0;
  if (iVar2 != 0) {
LAB_001947aa:
    pCsr->nInstCount = (int)uVar10;
    *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xf7;
    return iVar2;
  }
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  local_40 = &local_48->bEof;
  uVar11 = 0;
  pFVar3 = local_48;
  do {
    uVar6 = 0;
    uVar10 = 0xffffffffffffffff;
    puVar4 = local_40;
    while( true ) {
      iVar2 = (int)uVar10;
      uVar13 = uVar10 & 0xffffffff;
      if (uVar9 == uVar6) break;
      if ((*puVar4 == '\0') && ((iVar2 < 0 || (*(long *)(puVar4 + 7) < pFVar3[uVar13].iPos)))) {
        uVar10 = uVar6 & 0xffffffff;
      }
      uVar6 = uVar6 + 1;
      puVar4 = puVar4 + 0x20;
    }
    if (iVar2 < 0) {
      iVar2 = 0;
      uVar10 = uVar11 & 0xffffffff;
      goto LAB_001947aa;
    }
    uVar10 = uVar11 + 1;
    iVar5 = pCsr->nInstAlloc;
    pOld = pCsr->aInst;
    if (iVar5 <= (int)uVar10) {
      iVar7 = iVar5 * 2;
      if (iVar5 == 0) {
        iVar7 = 0x20;
      }
      pCsr->nInstAlloc = iVar7;
      pOld = (int *)sqlite3_realloc64(pOld,(long)iVar7 * 0xc);
      if (pOld == (int *)0x0) {
        iVar2 = 7;
        goto LAB_001947aa;
      }
      pCsr->aInst = pOld;
      pFVar3 = local_48;
    }
    pOld[uVar11 * 3] = iVar2;
    lVar12 = pFVar3[uVar13].iPos;
    iVar5 = (int)((ulong)lVar12 >> 0x20);
    pOld[uVar11 * 3 + 1] = iVar5;
    pOld[uVar11 * 3 + 2] = (uint)lVar12 & 0x7fffffff;
    iVar2 = 0x10b;
    if ((lVar12 < 0) || (iVar1 <= iVar5)) goto LAB_001947aa;
    sqlite3Fts5PoslistReaderNext(pFVar3 + uVar13);
    uVar11 = uVar10;
  } while( true );
}

Assistant:

static int fts5CacheInstArray(Fts5Cursor *pCsr){
  int rc = SQLITE_OK;
  Fts5PoslistReader *aIter;       /* One iterator for each phrase */
  int nIter;                      /* Number of iterators/phrases */
  int nCol = ((Fts5Table*)pCsr->base.pVtab)->pConfig->nCol;
  
  nIter = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  if( pCsr->aInstIter==0 ){
    sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nIter;
    pCsr->aInstIter = (Fts5PoslistReader*)sqlite3Fts5MallocZero(&rc, nByte);
  }
  aIter = pCsr->aInstIter;

  if( aIter ){
    int nInst = 0;                /* Number instances seen so far */
    int i;

    /* Initialize all iterators */
    for(i=0; i<nIter && rc==SQLITE_OK; i++){
      const u8 *a;
      int n; 
      rc = fts5CsrPoslist(pCsr, i, &a, &n);
      if( rc==SQLITE_OK ){
        sqlite3Fts5PoslistReaderInit(a, n, &aIter[i]);
      }
    }

    if( rc==SQLITE_OK ){
      while( 1 ){
        int *aInst;
        int iBest = -1;
        for(i=0; i<nIter; i++){
          if( (aIter[i].bEof==0) 
              && (iBest<0 || aIter[i].iPos<aIter[iBest].iPos) 
            ){
            iBest = i;
          }
        }
        if( iBest<0 ) break;

        nInst++;
        if( nInst>=pCsr->nInstAlloc ){
          pCsr->nInstAlloc = pCsr->nInstAlloc ? pCsr->nInstAlloc*2 : 32;
          aInst = (int*)sqlite3_realloc64(
              pCsr->aInst, pCsr->nInstAlloc*sizeof(int)*3
              );
          if( aInst ){
            pCsr->aInst = aInst;
          }else{
            rc = SQLITE_NOMEM;
            break;
          }
        }

        aInst = &pCsr->aInst[3 * (nInst-1)];
        aInst[0] = iBest;
        aInst[1] = FTS5_POS2COLUMN(aIter[iBest].iPos);
        aInst[2] = FTS5_POS2OFFSET(aIter[iBest].iPos);
        if( aInst[1]<0 || aInst[1]>=nCol ){
          rc = FTS5_CORRUPT;
          break;
        }
        sqlite3Fts5PoslistReaderNext(&aIter[iBest]);
      }
    }

    pCsr->nInstCount = nInst;
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_INST);
  }
  return rc;
}